

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * c4::arealloc(void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  bool bVar1;
  error_flags eVar2;
  arealloc_pfn p_Var3;
  void *pvVar4;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  void *in_RDI;
  void *nptr;
  arealloc_pfn fn;
  
  p_Var3 = get_arealloc();
  if (p_Var3 == (arealloc_pfn)0x0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3f0daf,(char *)0x4426,
                 "check failed: c4::get_arealloc() != nullptr\ndid you forget to call set_arealloc()?"
                );
  }
  p_Var3 = get_arealloc();
  pvVar4 = (*p_Var3)(in_RDI,in_RSI,in_RDX,in_RCX);
  return pvVar4;
}

Assistant:

void* arealloc(void *ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_arealloc() != nullptr, "did you forget to call set_arealloc()?");
    auto fn = c4::get_arealloc();
    void* nptr = fn(ptr, oldsz, newsz, alignment);
    return nptr;
}